

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_enc.c
# Opt level: O2

int64_t HistoQueuePush(HistoQueue *histo_queue,VP8LHistogram **histograms,int idx1,int idx2,
                      int64_t threshold)

{
  HistogramPair *pHVar1;
  int iVar2;
  HistogramPair pair;
  HistogramPair local_48;
  
  if (histo_queue->size == histo_queue->max_size) {
    return 0;
  }
  local_48.idx2 = idx2;
  if (idx2 < idx1) {
    local_48.idx2 = idx1;
  }
  if (idx1 < idx2) {
    idx2 = idx1;
  }
  local_48.idx1 = idx2;
  iVar2 = HistoQueueUpdatePair(histograms[idx2],histograms[local_48.idx2],threshold,&local_48);
  if (iVar2 == 0) {
    local_48.cost_diff = 0;
  }
  else {
    pHVar1 = histo_queue->queue;
    iVar2 = histo_queue->size;
    histo_queue->size = iVar2 + 1;
    pHVar1[iVar2].costs[3] = local_48.costs[3];
    (pHVar1[iVar2].costs + 3)[1] = local_48.costs[4];
    pHVar1[iVar2].costs[1] = local_48.costs[1];
    (pHVar1[iVar2].costs + 1)[1] = local_48.costs[2];
    pHVar1[iVar2].cost_combo = local_48.cost_combo;
    (&pHVar1[iVar2].cost_combo)[1] = local_48.costs[0];
    pHVar1 = pHVar1 + iVar2;
    pHVar1->idx1 = local_48.idx1;
    pHVar1->idx2 = local_48.idx2;
    pHVar1->cost_diff = local_48.cost_diff;
    HistoQueueUpdateHead(histo_queue,histo_queue->queue + (long)histo_queue->size + -1);
  }
  return local_48.cost_diff;
}

Assistant:

static int64_t HistoQueuePush(HistoQueue* const histo_queue,
                              VP8LHistogram** const histograms, int idx1,
                              int idx2, int64_t threshold) {
  const VP8LHistogram* h1;
  const VP8LHistogram* h2;
  HistogramPair pair;

  // Stop here if the queue is full.
  if (histo_queue->size == histo_queue->max_size) return 0;
  assert(threshold <= 0);
  if (idx1 > idx2) {
    const int tmp = idx2;
    idx2 = idx1;
    idx1 = tmp;
  }
  pair.idx1 = idx1;
  pair.idx2 = idx2;
  h1 = histograms[idx1];
  h2 = histograms[idx2];

  // Do not even consider the pair if it does not improve the entropy.
  if (!HistoQueueUpdatePair(h1, h2, threshold, &pair)) return 0;

  histo_queue->queue[histo_queue->size++] = pair;
  HistoQueueUpdateHead(histo_queue, &histo_queue->queue[histo_queue->size - 1]);

  return pair.cost_diff;
}